

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void glcts::anon_unknown_0::ShaderSourceFactory::streamSubroutineValidators
               (ostringstream *ret,
               vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               *subroutineUniforms,GLenum shader,char *outTemporary)

{
  bool bVar1;
  SubroutineFunction *pSVar2;
  pointer pSVar3;
  SubroutineUniform *this;
  ulong uVar4;
  int arrayElem;
  
  pSVar3 = (subroutineUniforms->
           super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((subroutineUniforms->
      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
      )._M_impl.super__Vector_impl_data._M_finish != pSVar3) {
    uVar4 = 0;
    do {
      bVar1 = DefOccurence::occurs
                        ((DefOccurence *)(ulong)pSVar3[uVar4].defOccurence.occurence,shader);
      if (((bVar1) && (this = pSVar3 + uVar4, this->used == true)) && (0 < this->arraySize)) {
        arrayElem = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                     "\n    if (any(greaterThan(abs(",0x1d);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                     (this->name)._M_dataplus._M_p,(this->name)._M_string_length);
          SubroutineUniform::streamArrayStr(this,ret,arrayElem);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"(zero) - ",9);
          pSVar2 = SubroutineUniform::getSelectedFunction(this,arrayElem);
          UniformValue::streamValue(&pSVar2->embeddedRetVal,ret,0,0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"), vec4(0.1)))) {",
                     0x11);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"\n       ",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"validationResult",
                     0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                     " = vec4 (1.0, 0.0, 0.0, 1.0);",0x1d);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"\n    }",6);
          arrayElem = arrayElem + 1;
        } while (arrayElem < this->arraySize);
      }
      uVar4 = uVar4 + 1;
      pSVar3 = (subroutineUniforms->
               super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)(((long)(subroutineUniforms->
                                    super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 3)
                            * 0x4fa4fa4fa4fa4fa5));
  }
  return;
}

Assistant:

static void streamSubroutineValidators(std::ostringstream&					 ret,
										   const std::vector<SubroutineUniform>& subroutineUniforms, GLenum shader,
										   const char* outTemporary)
	{
		for (size_t i = 0; i < subroutineUniforms.size(); i++)
		{
			streamSubroutineValidator(ret, subroutineUniforms[i], shader, outTemporary);
		}
	}